

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

IGUITab * __thiscall irr::gui::CGUITabControl::addTab(CGUITabControl *this,wchar_t *caption,s32 id)

{
  IGUIEnvironment *environment;
  vector2d<int> this_00;
  rect<int> local_40;
  
  this_00 = (vector2d<int>)operator_new(0x160);
  environment = *(IGUIEnvironment **)&this->field_0x128;
  local_40 = calcTabPos(this);
  CGUITab::CGUITab((CGUITab *)this_00,environment,(IGUIElement *)this,&local_40,id);
  (**(code **)(*(long *)this_00 + 0xa0))(this_00,caption);
  *(undefined4 *)((long)this_00 + 0x118) = 0;
  *(undefined4 *)((long)this_00 + 0x11c) = 1;
  *(undefined4 *)((long)this_00 + 0x120) = 0;
  *(undefined4 *)((long)this_00 + 0x124) = 1;
  (**(code **)(*(long *)this_00 + 0x78))(this_00,0);
  local_40.UpperLeftCorner = this_00;
  ::std::vector<irr::gui::IGUITab*,std::allocator<irr::gui::IGUITab*>>::
  emplace_back<irr::gui::IGUITab*>
            ((vector<irr::gui::IGUITab*,std::allocator<irr::gui::IGUITab*>> *)&this->Tabs,
             (IGUITab **)&local_40);
  (this->Tabs).is_sorted = false;
  if (this->ActiveTabIndex == -1) {
    this->ActiveTabIndex =
         (int)((ulong)((long)(this->Tabs).m_data.
                             super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->Tabs).m_data.
                            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    (**(code **)(*(long *)this_00 + 0x78))(this_00,1);
  }
  recalculateScrollBar(this);
  return (IGUITab *)this_00;
}

Assistant:

IGUITab *CGUITabControl::addTab(const wchar_t *caption, s32 id)
{
	CGUITab *tab = new CGUITab(Environment, this, calcTabPos(), id);

	tab->setText(caption);
	tab->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
	tab->setVisible(false);
	Tabs.push_back(tab); // no grab as new already creates a reference

	if (ActiveTabIndex == -1) {
		ActiveTabIndex = Tabs.size() - 1;
		tab->setVisible(true);
	}

	recalculateScrollBar();

	return tab;
}